

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::javanano::AccessorPrimitiveFieldGenerator::GenerateMembers
          (AccessorPrimitiveFieldGenerator *this,Printer *printer,bool lazy_init)

{
  bool bVar1;
  JavaType type;
  _Self local_68 [3];
  allocator<char> local_49;
  key_type local_48;
  _Self local_28;
  byte local_19;
  Printer *pPStack_18;
  bool lazy_init_local;
  Printer *printer_local;
  AccessorPrimitiveFieldGenerator *this_local;
  
  local_19 = lazy_init;
  pPStack_18 = printer;
  printer_local = (Printer *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"default_constant",&local_49);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->variables_,&local_48);
  local_68[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->variables_);
  bVar1 = std::operator!=(&local_28,local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  if (bVar1) {
    if ((local_19 & 1) == 0) {
      io::Printer::Print(pPStack_18,&this->variables_,
                         "private static final $type$ $default_constant$ =\n    $default_constant_value$;\n"
                        );
    }
    else {
      io::Printer::Print(pPStack_18,&this->variables_,"private static $type$ $default_constant$;\n")
      ;
    }
  }
  io::Printer::Print(pPStack_18,&this->variables_,
                     "private $type$ $name$_;\npublic $type$ get$capitalized_name$() {\n  return $name$_;\n}\npublic $message_name$ set$capitalized_name$($type$ value) {\n"
                    );
  type = GetJavaType(this->descriptor_);
  bVar1 = anon_unknown_5::IsReferenceType(type);
  if (bVar1) {
    io::Printer::Print(pPStack_18,&this->variables_,
                       "  if (value == null) {\n    throw new java.lang.NullPointerException();\n  }\n"
                      );
  }
  io::Printer::Print(pPStack_18,&this->variables_,
                     "  $name$_ = value;\n  $set_has$;\n  return this;\n}\npublic boolean has$capitalized_name$() {\n  return $get_has$;\n}\npublic $message_name$ clear$capitalized_name$() {\n  $name$_ = $default_copy_if_needed$;\n  $clear_has$;\n  return this;\n}\n"
                    );
  return;
}

Assistant:

void AccessorPrimitiveFieldGenerator::
GenerateMembers(io::Printer* printer, bool lazy_init) const {
  if (variables_.find("default_constant") != variables_.end()) {
    // Those primitive types that need a saved default.
    if (lazy_init) {
      printer->Print(variables_,
        "private static $type$ $default_constant$;\n");
    } else {
      printer->Print(variables_,
        "private static final $type$ $default_constant$ =\n"
        "    $default_constant_value$;\n");
    }
  }
  printer->Print(variables_,
    "private $type$ $name$_;\n"
    "public $type$ get$capitalized_name$() {\n"
    "  return $name$_;\n"
    "}\n"
    "public $message_name$ set$capitalized_name$($type$ value) {\n");
  if (IsReferenceType(GetJavaType(descriptor_))) {
    printer->Print(variables_,
      "  if (value == null) {\n"
      "    throw new java.lang.NullPointerException();\n"
      "  }\n");
  }
  printer->Print(variables_,
    "  $name$_ = value;\n"
    "  $set_has$;\n"
    "  return this;\n"
    "}\n"
    "public boolean has$capitalized_name$() {\n"
    "  return $get_has$;\n"
    "}\n"
    "public $message_name$ clear$capitalized_name$() {\n"
    "  $name$_ = $default_copy_if_needed$;\n"
    "  $clear_has$;\n"
    "  return this;\n"
    "}\n");
}